

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

void highsAssert(bool assert_condition,string *message)

{
  undefined8 uVar1;
  byte in_DIL;
  
  if ((in_DIL & 1) != 0) {
    return;
  }
  uVar1 = std::__cxx11::string::c_str();
  printf("Failing highsAssert(\"%s\")\n",uVar1);
  uVar1 = std::__cxx11::string::c_str();
  printf("assert(%s) failed ...\n",uVar1);
  fflush(_stdout);
  abort();
}

Assistant:

void highsAssert(const bool assert_condition, const std::string message) {
  if (assert_condition) return;
  printf("Failing highsAssert(\"%s\")\n", message.c_str());
#ifdef NDEBUG
  // Standard assert won't trigger abort, so do it explicitly
  printf("assert(%s) failed ...\n", message.c_str());
  fflush(stdout);
  abort();
#else
  // Standard assert
  assert(assert_condition);
#endif
}